

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

size_t Variant_calcSizeBinary(UA_Variant *src,UA_DataType *_)

{
  byte bVar1;
  ushort uVar2;
  UA_DataType *pUVar3;
  UA_calcSizeBinarySignature p_Var4;
  size_t sVar5;
  size_t sVar6;
  UA_DataType *__00;
  size_t sVar7;
  void *pvVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auStack_58 [8];
  UA_NodeId typeId;
  
  pUVar3 = src->type;
  if (pUVar3 == (UA_DataType *)0x0) {
    sVar6 = 1;
  }
  else {
    bVar9 = true;
    if (src->arrayLength == 0) {
      bVar9 = src->data < (void *)0x2;
    }
    if (bVar9 == false) {
      bVar10 = false;
    }
    else {
      bVar10 = src->arrayDimensionsSize != 0;
    }
    bVar1 = pUVar3->field_0x25;
    auStack_58._0_2_ = 0;
    auStack_58._2_2_ = 0;
    auStack_58._4_4_ = UA_NODEIDTYPE_NUMERIC;
    typeId.namespaceIndex = 0;
    typeId._2_2_ = 0;
    typeId.identifierType = UA_NODEIDTYPE_NUMERIC;
    typeId.identifier.string.length = 0;
    if ((bVar1 & 1) == 0) {
      auStack_58._0_2_ = (pUVar3->typeId).namespaceIndex;
      auStack_58._2_2_ = *(undefined2 *)&(pUVar3->typeId).field_0x2;
      auStack_58._4_4_ = (pUVar3->typeId).identifierType;
      typeId._0_8_ = (pUVar3->typeId).identifier.string.length;
      typeId.identifier.string.length = (size_t)(pUVar3->typeId).identifier.string.data;
      if (auStack_58._4_4_ != UA_NODEIDTYPE_NUMERIC) {
        return 0;
      }
      __00 = (UA_DataType *)0x19;
    }
    else {
      __00 = (UA_DataType *)(ulong)pUVar3->typeIndex;
    }
    sVar6 = (ulong)bVar9 * 4 + 1;
    sVar7 = 1;
    if (bVar9 != false) {
      sVar7 = src->arrayLength;
    }
    typeId.identifier.string.data = (UA_Byte *)src;
    if (sVar7 != 0) {
      uVar2 = pUVar3->memSize;
      pvVar8 = src->data;
      p_Var4 = calcSizeBinaryJumpTable[(long)__00];
      do {
        if ((bVar1 & 1) == 0) {
          sVar5 = NodeId_calcSizeBinary((UA_NodeId *)auStack_58,__00);
          sVar6 = sVar6 + sVar5 + 5;
        }
        __00 = *(UA_DataType **)typeId.identifier.string.data;
        sVar5 = (*p_Var4)(pvVar8,__00);
        sVar6 = sVar5 + sVar6;
        pvVar8 = (void *)((long)pvVar8 + (ulong)uVar2);
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
    }
    if (bVar10) {
      sVar7 = Array_calcSizeBinary
                        (*(void **)(typeId.identifier.string.data + 0x28),
                         *(size_t *)(typeId.identifier.string.data + 0x20),UA_TYPES + 5);
      sVar6 = sVar6 + sVar7;
    }
  }
  return sVar6;
}

Assistant:

static size_t
Variant_calcSizeBinary(UA_Variant const *src, UA_DataType *_) {
    size_t s = 1; /* encoding byte */
    if(!src->type)
        return s;

    UA_Boolean isArray = src->arrayLength > 0 || src->data <= UA_EMPTY_ARRAY_SENTINEL;
    UA_Boolean hasDimensions = isArray && src->arrayDimensionsSize > 0;
    UA_Boolean isBuiltin = src->type->builtin;

    UA_NodeId typeId;
    UA_NodeId_init(&typeId);
    size_t encode_index = src->type->typeIndex;
    if(!isBuiltin) {
        encode_index = UA_BUILTIN_TYPES_COUNT;
        typeId = src->type->typeId;
        if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
            return 0;
    }

    size_t length = src->arrayLength;
    if(isArray)
        s += 4;
    else
        length = 1;

    uintptr_t ptr = (uintptr_t)src->data;
    size_t memSize = src->type->memSize;
    for(size_t i = 0; i < length; ++i) {
        if(!isBuiltin) {
            /* The type is wrapped inside an extensionobject */
            s += NodeId_calcSizeBinary(&typeId, NULL);
            s += 1 + 4; // encoding byte + length
        }
        s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, src->type);
        ptr += memSize;
    }

    if(hasDimensions)
        s += Array_calcSizeBinary(src->arrayDimensions, src->arrayDimensionsSize,
                                  &UA_TYPES[UA_TYPES_INT32]);
    return s;
}